

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O2

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  long lVar3;
  MCInst *MI_00;
  DecodeStatus DVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint16_t uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  void *Decoder;
  ulong insn;
  bool bVar12;
  bool bVar13;
  uint local_58;
  DecodeStatus local_54;
  ulong local_50;
  MCInst *local_48;
  uint64_t local_40;
  ulong local_38;
  
  bVar12 = 0xbf < *code;
  puVar11 = DecoderTable48;
  if (!bVar12) {
    puVar11 = "\x01\x18\b\x02@\x04";
  }
  bVar13 = 0x3f < *code;
  uVar8 = 2;
  if (bVar13) {
    uVar8 = bVar12 + 4 + (ushort)bVar12;
  }
  uVar5 = 2;
  if (bVar13) {
    uVar5 = (ulong)((uint)bVar12 * 2) | 4;
  }
  puVar10 = "\x01\b\b\x02\x01T";
  if (bVar13) {
    puVar10 = puVar11;
  }
  *size = uVar8;
  if (code_len < uVar5) {
LAB_0023ab93:
    return false;
  }
  __s = MI->flat_insn->detail;
  Decoder = (void *)address;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x120);
    uVar5 = (ulong)*size;
  }
  insn = 0;
  for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    insn = insn << 8 | (ulong)code[uVar9];
  }
  local_50 = ~insn;
  local_38 = 0;
  local_54 = MCDisassembler_Success;
  local_48 = MI;
  local_40 = address;
LAB_0023a9f9:
  uVar5 = local_38 & 0xffffffff;
LAB_0023aa00:
  puVar11 = puVar10;
  switch(*puVar11) {
  case '\x01':
    goto switchD_0023aa18_caseD_1;
  case '\x02':
    uVar6 = decodeULEB128(puVar11 + 1,&local_58);
    puVar10 = puVar11 + (ulong)local_58 + 3;
    if (uVar6 == uVar5) goto LAB_0023aa00;
    lVar3 = (ulong)local_58 + 1;
    break;
  case '\x03':
    bVar1 = puVar11[1];
    bVar2 = puVar11[2];
    local_58 = (uint)bVar2;
    uVar9 = ~(-1L << (bVar2 & 0x3f)) << (bVar1 & 0x3f);
    if (bVar2 == 0x40) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar6 = decodeULEB128(puVar11 + 3,&local_58);
    puVar10 = puVar11 + (ulong)local_58 + 5;
    if ((uVar6 & 0xffffffff) == (uVar9 & insn) >> (bVar1 & 0x3f)) goto LAB_0023aa00;
    lVar3 = (ulong)local_58 + 3;
    break;
  case '\x04':
    goto switchD_0023aa18_caseD_4;
  case '\x05':
    uVar6 = decodeULEB128(puVar11 + 1,&local_58);
    uVar7 = decodeULEB128(puVar11 + (ulong)local_58 + 1,&local_58);
    MI_00 = local_48;
    MCInst_setOpcode(local_48,(uint)uVar6);
    DVar4 = decodeToMCInst(local_54,(uint)uVar7,insn,MI_00,local_40,Decoder);
    return DVar4 != MCDisassembler_Fail;
  case '\x06':
    uVar6 = decodeULEB128(puVar11 + 1,&local_58);
    uVar5 = (ulong)local_58;
    uVar7 = decodeULEB128(puVar11 + uVar5 + 1,&local_58);
    puVar10 = puVar11 + uVar5 + 1 + local_58;
    if ((uVar7 & local_50) != 0 || (uVar6 & insn) != 0) {
      local_54 = MCDisassembler_SoftFail;
    }
    goto LAB_0023a9f9;
  default:
    goto LAB_0023ab93;
  }
  puVar10 = puVar10 + *(ushort *)(puVar11 + lVar3);
  goto LAB_0023aa00;
switchD_0023aa18_caseD_4:
  decodeULEB128(puVar11 + 1,&local_58);
  puVar10 = puVar11 + (ulong)local_58 + 3;
  goto LAB_0023aa00;
switchD_0023aa18_caseD_1:
  bVar1 = puVar11[2];
  puVar10 = puVar11 + 3;
  local_58 = (uint)bVar1;
  uVar5 = ~(-1L << (bVar1 & 0x3f)) << (puVar11[1] & 0x3f);
  if (bVar1 == 0x40) {
    uVar5 = 0xffffffffffffffff;
  }
  local_38 = (uVar5 & insn) >> (puVar11[1] & 0x3f);
  goto LAB_0023a9f9;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	const uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, sysz)+sizeof(cs_sysz));
	}

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | code[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}